

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::PopAndCheckCall
          (TypeChecker *this,TypeVector *param_types,TypeVector *result_types,char *desc)

{
  Result rhs;
  size_type drop_count;
  char *desc_local;
  TypeVector *result_types_local;
  TypeVector *param_types_local;
  TypeChecker *this_local;
  Result result;
  
  this_local._4_4_ = CheckSignature(this,param_types,desc);
  drop_count = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(param_types);
  rhs = DropTypes(this,drop_count);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  PushTypes(this,result_types);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::PopAndCheckCall(const TypeVector& param_types,
                                    const TypeVector& result_types,
                                    const char* desc) {
  Result result = CheckSignature(param_types, desc);
  result |= DropTypes(param_types.size());
  PushTypes(result_types);
  return result;
}